

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_AdderTree(FILE *pFile,int nArgs,int nBits)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  char *in_stack_ffffffffffffffa8;
  
  uVar2 = Abc_Base10Log(nBits);
  iVar3 = Abc_Base2Log(nArgs);
  if ((1 < nArgs) && (1 < nBits)) {
    fprintf((FILE *)pFile,"module adder_tree_%d_%d (\n   ",(ulong)(uint)nArgs,(ulong)(uint)nBits);
    for (uVar6 = 0; uVar6 != nBits; uVar6 = uVar6 + 1) {
      for (uVar5 = 0; nArgs != uVar5; uVar5 = uVar5 + 1) {
        fprintf((FILE *)pFile," i%0*d_%0*d,",(ulong)uVar2,(ulong)uVar5,(ulong)uVar2,
                (ulong)(~uVar6 + nBits));
      }
      fwrite("\n   ",4,1,(FILE *)pFile);
    }
    fwrite(" z\n",3,1,(FILE *)pFile);
    fwrite("  );\n",5,1,(FILE *)pFile);
    for (uVar6 = 0; uVar6 != nBits; uVar6 = uVar6 + 1) {
      fwrite("  input",7,1,(FILE *)pFile);
      for (uVar5 = 0; uVar5 != nArgs; uVar5 = uVar5 + 1) {
        in_stack_ffffffffffffffa8 = ",";
        if (uVar5 - nArgs == -1) {
          in_stack_ffffffffffffffa8 = "";
        }
        fprintf((FILE *)pFile," i%0*d_%0*d%s",(ulong)uVar2,(ulong)uVar5,(ulong)uVar2,
                (ulong)(~uVar6 + nBits),in_stack_ffffffffffffffa8);
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    fprintf((FILE *)pFile,"  output [%d:0] z;\n");
    for (uVar6 = 0; uVar6 != nArgs; uVar6 = uVar6 + 1) {
      fprintf((FILE *)pFile,"  wire [%d:0] t%d = {",(ulong)(nBits - 1U),(ulong)uVar6);
      uVar5 = nBits - 1U;
      while (uVar4 = (ulong)uVar5, uVar5 != 0xffffffff) {
        bVar7 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        in_stack_ffffffffffffffa8 = ",";
        if (bVar7) {
          in_stack_ffffffffffffffa8 = "";
        }
        fprintf((FILE *)pFile," i%0*d_%0*d%s",(ulong)uVar2,(ulong)uVar6,(ulong)uVar2,uVar4,
                in_stack_ffffffffffffffa8);
      }
      fwrite(" };\n",4,1,(FILE *)pFile);
    }
    uVar2 = nArgs - 1U;
    uVar6 = 0;
    while (bVar7 = uVar2 != 0, uVar2 = uVar2 - 1, bVar7) {
      uVar5 = uVar6 + 1;
      pcVar1 = "cQ b(N b+N D(bN c+N N.b( +8bN bD(N. +8cN bQ( b+Q b(QD cQ+ Qjb( +Qb8 bQDj( s";
      if (uVar6 == 0) {
        pcVar1 = "v+ 4Dvk v6gU 7vU v>7U vU7H gU7v 6UvM v6U+Q Vv6 g6Vv 7Ulv 7vUl> 7Vv y7V t6 t";
      }
      in_stack_ffffffffffffffa8 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),uVar6);
      fprintf((FILE *)pFile,"  wire [%d:0] s%d = t%d + %s%d;\n",(ulong)((nBits + iVar3) - 1),
              (ulong)uVar5,(ulong)uVar5,pcVar1 + 0x4a,in_stack_ffffffffffffffa8);
      uVar6 = uVar5;
    }
    fprintf((FILE *)pFile,"  assign z = s%d;\n",(ulong)(nArgs - 1U));
    fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
    return;
  }
  __assert_fail("nArgs > 1 && nBits > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                ,0x347,"void Abc_AdderTree(FILE *, int, int)");
}

Assistant:

void Abc_AdderTree( FILE * pFile, int nArgs, int nBits )
{
    int i, k, nDigits = Abc_Base10Log( nBits ), Log2 = Abc_Base2Log( nArgs );
    assert( nArgs > 1 && nBits > 1 );
    fprintf( pFile, "module adder_tree_%d_%d (\n   ", nArgs, nBits );
    for ( i = 0; i < nBits; i++, fprintf(pFile, "\n   ") )
        for ( k = 0; k < nArgs; k++ )
            fprintf( pFile, " i%0*d_%0*d,", nDigits, k, nDigits, nBits-1-i );
    fprintf( pFile, " z\n" );
    fprintf( pFile, "  );\n" );
    for ( i = 0; i < nBits; i++ )
    {
        fprintf( pFile, "  input" );
        for ( k = 0; k < nArgs; k++ )
            fprintf( pFile, " i%0*d_%0*d%s", nDigits, k, nDigits, nBits-1-i, k==nArgs-1 ? "":"," );
        fprintf( pFile, ";\n" );
    }
    fprintf( pFile, "  output [%d:0] z;\n", nBits+Log2-1 );
    for ( i = 0; i < nArgs; i++ )
    {
        fprintf( pFile, "  wire [%d:0] t%d = {", nBits-1, i );
        for ( k = 0; k < nBits; k++ )
            fprintf( pFile, " i%0*d_%0*d%s", nDigits, i, nDigits, nBits-1-k, k==nBits-1 ? "":"," );
        fprintf( pFile, " };\n" );
    }
    for ( i = 0; i < nArgs-1; i++ )
        fprintf( pFile, "  wire [%d:0] s%d = t%d + %s%d;\n", nBits+Log2-1, i+1, i+1, i ? "s":"t", i );
    fprintf( pFile, "  assign z = s%d;\n", nArgs-1 );
    fprintf( pFile, "endmodule\n\n" ); 
}